

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

bool __thiscall
SoftHSM::isMechanismPermitted(SoftHSM *this,OSObject *key,CK_MECHANISM_PTR pMechanism)

{
  bool bVar1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  long *in_RSI;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> allowed;
  OSAttribute attribute;
  _List_iterator<unsigned_long> it;
  list<unsigned_long,_std::allocator<unsigned_long>_> mechs;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffe88;
  iterator in_stack_fffffffffffffe90;
  unsigned_long *in_stack_fffffffffffffe98;
  _List_iterator<unsigned_long> __last;
  _List_iterator<unsigned_long> in_stack_fffffffffffffea8;
  _Self local_150;
  _Self local_148 [2];
  list<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec8;
  list<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed0;
  OSAttribute local_110;
  undefined4 local_6c;
  _Self local_68 [3];
  _List_node_base *local_50;
  _List_node_base *local_48;
  _Self local_40;
  _List_node_base local_38 [2];
  long *local_18;
  bool local_1;
  
  __last._M_node = local_38;
  local_18 = in_RSI;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_48 = (_List_node_base *)
             std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe88);
  local_50 = (_List_node_base *)
             std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe88);
  local_40._M_node =
       (_List_node_base *)
       std::find<std::_List_iterator<unsigned_long>,unsigned_long>
                 (in_stack_fffffffffffffea8,__last,in_stack_fffffffffffffe98);
  local_68[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((list<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe88);
  bVar1 = std::operator==(&local_40,local_68);
  if (bVar1) {
    local_1 = false;
    local_6c = 1;
  }
  else {
    (**(code **)(*local_18 + 0x18))(&local_110,local_18,0x40000600);
    this_00 = OSAttribute::getMechanismTypeSetValue(&local_110);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffe90._M_node,in_stack_fffffffffffffe88);
    bVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::empty
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x166aac);
    if (bVar1) {
      local_1 = true;
    }
    else {
      in_stack_fffffffffffffe90 =
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                     (this_00,in_stack_fffffffffffffe90._M_node);
      local_148[0]._M_node = in_stack_fffffffffffffe90._M_node;
      local_150._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     (in_stack_fffffffffffffe88);
      local_1 = std::operator!=(local_148,&local_150);
    }
    local_6c = 1;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0x166b64);
    OSAttribute::~OSAttribute((OSAttribute *)in_stack_fffffffffffffe90._M_node);
  }
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x166b89);
  return (bool)(local_1 & 1);
}

Assistant:

bool SoftHSM::isMechanismPermitted(OSObject* key, CK_MECHANISM_PTR pMechanism)
{
	std::list<CK_MECHANISM_TYPE> mechs = supportedMechanisms;
	/* First check if the algorithm is enabled in the global configuration */
	auto it = std::find(mechs.begin(), mechs.end(), pMechanism->mechanism);
	if (it == mechs.end())
		return false;

	OSAttribute attribute = key->getAttribute(CKA_ALLOWED_MECHANISMS);
	std::set<CK_MECHANISM_TYPE> allowed = attribute.getMechanismTypeSetValue();

	if (allowed.empty()) {
		return true;
	}

	return allowed.find(pMechanism->mechanism) != allowed.end();
}